

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O1

bool deqp::egl::notColorBits<5,5,5,1>(CandidateConfig *c)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = eglu::CandidateConfig::redSize(c);
  bVar2 = true;
  if (iVar1 == 5) {
    iVar1 = eglu::CandidateConfig::greenSize(c);
    if (iVar1 == 5) {
      iVar1 = eglu::CandidateConfig::blueSize(c);
      if (iVar1 == 5) {
        iVar1 = eglu::CandidateConfig::alphaSize(c);
        bVar2 = iVar1 != 1;
      }
    }
  }
  return bVar2;
}

Assistant:

static bool notColorBits (const eglu::CandidateConfig& c)
{
	return c.redSize()		!= Red		||
		   c.greenSize()	!= Green	||
		   c.blueSize()		!= Blue		||
		   c.alphaSize()	!= Alpha;
}